

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

int generate_C_code(Ravi_CompilerInterface *ravi_interface,Proc *proc,TextBuffer *mb)

{
  TextBuffer *mb_00;
  TextBuffer *mb_01;
  BasicBlock *pBVar1;
  int iVar2;
  Instruction *insn;
  Proc *proc_00;
  long lVar3;
  Function fn;
  PtrListIterator insniter__;
  Function local_180;
  PtrListIterator local_48;
  
  mb_00 = &local_180.prologue;
  local_180.proc = proc;
  local_180.api = ravi_interface;
  snprintf(proc->funcname,0x1e,"__ravifunc_%d",(ulong)proc->id);
  raviX_buffer_init(mb_00,0x1000);
  raviX_buffer_init(&local_180.body,0x1000);
  raviX_buffer_init(&local_180.tb,0x100);
  raviX_buffer_init(&local_180.C_local_declarations,0x100);
  raviX_buffer_add_fstring(mb_00,"static int %s(lua_State *L) {\n",proc->funcname);
  raviX_buffer_add_string(mb_00,"int raviX__error_code = 0;\n");
  raviX_buffer_add_string(mb_00,"int result = 0;\n");
  raviX_buffer_add_string(mb_00,"CallInfo *ci = L->ci;\n");
  raviX_buffer_add_string(mb_00,"LClosure *cl = clLvalue(ci->func);\n");
  raviX_buffer_add_string(mb_00,"TValue *k = cl->p->k;\n");
  raviX_buffer_add_string(mb_00,"StkId base = ci->u.l.base;\n");
  emit_vars("lua_Integer","raviX__i_",&proc->temp_int_pseudos,mb_00);
  emit_vars("lua_Number","raviX__f_",&proc->temp_flt_pseudos,mb_00);
  emit_vars("lua_Integer","raviX__i_",&proc->temp_int_pseudos,&local_180.C_local_declarations);
  mb_01 = &local_180.body;
  emit_vars("lua_Number","raviX__f_",&proc->temp_flt_pseudos,&local_180.C_local_declarations);
  raviX_buffer_add_string(mb_00,"TValue ival0; settt_(&ival0, LUA_TNUMINT);\n");
  raviX_buffer_add_string(mb_00,"TValue fval0; settt_(&fval0, LUA_TNUMFLT);\n");
  raviX_buffer_add_string(mb_00,"TValue bval0; settt_(&bval0, LUA_TBOOLEAN);\n");
  raviX_buffer_add_string(mb_00,"TValue ival1; settt_(&ival1, LUA_TNUMINT);\n");
  raviX_buffer_add_string(mb_00,"TValue fval1; settt_(&fval1, LUA_TNUMFLT);\n");
  raviX_buffer_add_string(mb_00,"TValue bval1; settt_(&bval1, LUA_TBOOLEAN);\n");
  raviX_buffer_add_string(mb_00,"TValue ival2; settt_(&ival2, LUA_TNUMINT);\n");
  raviX_buffer_add_string(mb_00,"TValue fval2; settt_(&fval2, LUA_TNUMFLT);\n");
  raviX_buffer_add_string(mb_00,"TValue bval2; settt_(&bval2, LUA_TBOOLEAN);\n");
  raviX_buffer_add_string(mb_00,"TValue nilval; setnilvalue(&nilval);\n");
  iVar2 = _setjmp((__jmp_buf_tag *)local_180.env);
  if (iVar2 == 0) {
    iVar2 = 0;
    if (0 < (int)proc->node_count) {
      lVar3 = 0;
      do {
        pBVar1 = proc->nodes[lVar3];
        if ((pBVar1->index < 2) ||
           (iVar2 = raviX_ptrlist_size((PtrList *)pBVar1->insns), iVar2 != 0)) {
          raviX_buffer_add_fstring(mb_01,"L%d:\n",(ulong)pBVar1->index);
          raviX_ptrlist_forward_iterator(&local_48,(PtrList *)pBVar1->insns);
          insn = (Instruction *)raviX_ptrlist_iter_next(&local_48);
          while ((iVar2 = 0, insn != (Instruction *)0x0 &&
                 (iVar2 = output_instruction(&local_180,insn), iVar2 == 0))) {
            insn = (Instruction *)raviX_ptrlist_iter_next(&local_48);
          }
          if (pBVar1->index == 1) {
            raviX_buffer_add_string(mb_01," return result;\n");
            raviX_buffer_add_string(mb_01,"Lraise_error:\n");
            raviX_buffer_add_string
                      (mb_01," raviV_raise_error(L, raviX__error_code); /* does not return */\n");
            raviX_buffer_add_string(mb_01," return result;\n");
          }
        }
        else {
          iVar2 = 0;
        }
        if (iVar2 != 0) goto LAB_0011e2e8;
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)proc->node_count);
      iVar2 = 0;
    }
LAB_0011e2e8:
    raviX_buffer_add_string(mb_01,"}\n");
    raviX_buffer_add_string(mb,local_180.prologue.buf);
    raviX_buffer_add_string(mb,local_180.body.buf);
  }
  raviX_buffer_free(&local_180.prologue);
  raviX_buffer_free(mb_01);
  raviX_buffer_free(&local_180.tb);
  raviX_buffer_free(&local_180.C_local_declarations);
  if (iVar2 == 0) {
    raviX_ptrlist_forward_iterator((PtrListIterator *)&local_180,(PtrList *)proc->procs);
    proc_00 = (Proc *)raviX_ptrlist_iter_next((PtrListIterator *)&local_180);
    iVar2 = 0;
    if (proc_00 != (Proc *)0x0) {
      do {
        iVar2 = generate_C_code(ravi_interface,proc_00,mb);
        if (iVar2 != 0) {
          return iVar2;
        }
        proc_00 = (Proc *)raviX_ptrlist_iter_next((PtrListIterator *)&local_180);
        iVar2 = 0;
      } while (proc_00 != (Proc *)0x0);
    }
  }
  return iVar2;
}

Assistant:

static int generate_C_code(struct Ravi_CompilerInterface *ravi_interface, Proc *proc, TextBuffer *mb)
{
	int rc = 0;
	{
		Function fn;
		initfn(&fn, proc, ravi_interface);
		rc = setjmp(fn.env);
		if (rc == 0) {
			BasicBlock *bb;
			for (int i = 0; i < (int)proc->node_count; i++) {
				bb = proc->nodes[i];
				rc = output_basic_block(&fn, bb);
				if (rc != 0)
					break;
			}

			raviX_buffer_add_string(&fn.body, "}\n");
			raviX_buffer_add_string(mb, fn.prologue.buf);
			raviX_buffer_add_string(mb, fn.body.buf);
		}
		cleanup(&fn);
	}
	if (rc != 0)
		return rc;

	Proc *childproc;
	FOR_EACH_PTR(proc->procs, Proc, childproc)
	{
		rc = generate_C_code(ravi_interface, childproc, mb);
		if (rc != 0)
			return rc;
	}
	END_FOR_EACH_PTR(childproc)
	return 0;
}